

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall Am_Demon_Queue::Reset(Am_Demon_Queue *this)

{
  QItem *pQVar1;
  Am_Demon_Queue_Data *pAVar2;
  QItem *this_00;
  
  if (this->data->active == true) {
    this_00 = this->data->head;
    while (this_00 != (QItem *)0x0) {
      pQVar1 = this_00->next;
      QItem::~QItem(this_00);
      QItem::operator_delete(this_00,0x20);
      this_00 = pQVar1;
    }
    pAVar2 = this->data;
    pAVar2->head = (QItem *)0x0;
    pAVar2->tail = (QItem *)0x0;
    pAVar2->invoke_stack = 0;
  }
  return;
}

Assistant:

void
Am_Demon_Queue::Reset()
{
  if (!data->active)
    return;

  QItem *curr = data->head;
  QItem *next;

  while (curr) {
    next = curr->next;
    delete curr;
    curr = next;
  }
  data->head = data->tail = nullptr;
  data->invoke_stack = 0;
}